

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visitUnary
          (Flow *__return_storage_ptr__,
          ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *this,Unary *curr)

{
  Name breakTo;
  Name breakTo_00;
  Name breakTo_01;
  Name breakTo_02;
  char *curr_00;
  bool bVar1;
  Literal *pLVar2;
  Literal local_b70;
  Literal local_b58;
  Literal local_b40;
  Literal local_b28;
  Literal local_b10;
  Literal local_af8;
  Literal local_ae0;
  size_t local_ac8;
  char *pcStack_ac0;
  Literal local_ab0;
  size_t local_a98;
  char *pcStack_a90;
  Literal local_a80;
  Literal local_a68;
  Literal local_a50;
  Literal local_a38;
  Literal local_a20;
  Literal local_a08;
  Literal local_9f0;
  Literal local_9d8;
  Literal local_9c0;
  Literal local_9a8;
  Literal local_990;
  Literal local_978;
  Literal local_960;
  Literal local_948;
  Literal local_930;
  Literal local_918;
  Literal local_900;
  size_t local_8e8;
  char *pcStack_8e0;
  Literal local_8d0;
  size_t local_8b8;
  char *pcStack_8b0;
  Literal local_8a0;
  Literal local_888;
  Literal local_870;
  Literal local_858;
  Literal local_840;
  Literal local_828;
  Literal local_810;
  Literal local_7f8;
  Literal local_7e0;
  Literal local_7c8;
  Literal local_7b0;
  Literal local_798;
  Literal local_780;
  Literal local_768;
  Literal local_750;
  Literal local_738;
  Literal local_720;
  Literal local_708;
  Literal local_6f0;
  Literal local_6d8;
  Literal local_6c0;
  Literal local_6a8;
  Literal local_690;
  Literal local_678;
  Literal local_660;
  Literal local_648;
  Literal local_630;
  Literal local_618;
  Literal local_600;
  Literal local_5e8;
  Literal local_5d0;
  Literal local_5b8;
  Literal local_5a0;
  Literal local_588;
  Literal local_570;
  Literal local_558;
  Literal local_540;
  Literal local_528;
  Literal local_510;
  Literal local_4f8;
  Literal local_4e0;
  Literal local_4c8;
  Literal local_4b0;
  Literal local_498;
  Literal local_480;
  Literal local_468;
  Literal local_450;
  Literal local_438;
  Literal local_420;
  Literal local_408;
  Literal local_3f0;
  Literal local_3d8;
  Literal local_3c0;
  Literal local_3a8;
  Literal local_390;
  Literal local_378;
  Literal local_360;
  Literal local_348;
  Literal local_330;
  Literal local_318;
  Literal local_300;
  Literal local_2e8;
  Literal local_2d0;
  Literal local_2b8;
  Literal local_2a0;
  Literal local_288;
  Literal local_270;
  Literal local_258;
  Literal local_240;
  Literal local_228;
  Literal local_210;
  Literal local_1f8;
  Literal local_1e0;
  Literal local_1c8;
  Literal local_1b0;
  Literal local_198;
  Literal local_180;
  Literal local_168;
  Literal local_150;
  Literal local_138;
  Literal local_120;
  Literal local_108;
  Literal local_f0;
  Literal local_d8;
  Literal local_c0;
  Literal local_a8;
  undefined1 local_90 [8];
  Literal value;
  undefined1 local_68 [8];
  Flow flow;
  Unary *curr_local;
  ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *this_local;
  
  flow.breakTo.super_IString.str._M_str = (char *)curr;
  visit((Flow *)local_68,this,*(Expression **)(curr + 0x18));
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
    value.type.id._0_4_ = 1;
    goto LAB_001a8b5a;
  }
  pLVar2 = Flow::getSingleValue((Flow *)local_68);
  ::wasm::Literal::Literal((Literal *)local_90,pLVar2);
  curr_00 = flow.breakTo.super_IString.str._M_str;
  switch(*(undefined4 *)(flow.breakTo.super_IString.str._M_str + 0x10)) {
  case 0:
  case 1:
    ::wasm::Literal::countLeadingZeroes();
    Flow::Flow(__return_storage_ptr__,&local_a8);
    ::wasm::Literal::~Literal(&local_a8);
    break;
  case 2:
  case 3:
    ::wasm::Literal::countTrailingZeroes();
    Flow::Flow(__return_storage_ptr__,&local_c0);
    ::wasm::Literal::~Literal(&local_c0);
    break;
  case 4:
  case 5:
    ::wasm::Literal::popCount();
    Flow::Flow(__return_storage_ptr__,&local_d8);
    ::wasm::Literal::~Literal(&local_d8);
    break;
  case 6:
  case 7:
    ::wasm::Literal::neg();
    Flow::Flow(__return_storage_ptr__,&local_228);
    ::wasm::Literal::~Literal(&local_228);
    break;
  case 8:
  case 9:
    ::wasm::Literal::abs();
    Flow::Flow(__return_storage_ptr__,&local_240);
    ::wasm::Literal::~Literal(&local_240);
    break;
  case 10:
  case 0xb:
    ::wasm::Literal::ceil();
    Flow::Flow(__return_storage_ptr__,&local_258);
    ::wasm::Literal::~Literal(&local_258);
    break;
  case 0xc:
  case 0xd:
    ::wasm::Literal::floor();
    Flow::Flow(__return_storage_ptr__,&local_270);
    ::wasm::Literal::~Literal(&local_270);
    break;
  case 0xe:
  case 0xf:
    ::wasm::Literal::trunc();
    Flow::Flow(__return_storage_ptr__,&local_288);
    ::wasm::Literal::~Literal(&local_288);
    break;
  case 0x10:
  case 0x11:
    ::wasm::Literal::nearbyint();
    Flow::Flow(__return_storage_ptr__,&local_2a0);
    ::wasm::Literal::~Literal(&local_2a0);
    break;
  case 0x12:
  case 0x13:
    ::wasm::Literal::sqrt();
    Flow::Flow(__return_storage_ptr__,&local_2b8);
    ::wasm::Literal::~Literal(&local_2b8);
    break;
  case 0x14:
  case 0x15:
    ::wasm::Literal::eqz();
    Flow::Flow(__return_storage_ptr__,&local_f0);
    ::wasm::Literal::~Literal(&local_f0);
    break;
  case 0x16:
    ::wasm::Literal::extendToSI64();
    Flow::Flow(__return_storage_ptr__,&local_138);
    ::wasm::Literal::~Literal(&local_138);
    break;
  case 0x17:
    ::wasm::Literal::extendToUI64();
    Flow::Flow(__return_storage_ptr__,&local_150);
    ::wasm::Literal::~Literal(&local_150);
    break;
  case 0x18:
    ::wasm::Literal::wrapToI32();
    Flow::Flow(__return_storage_ptr__,&local_168);
    ::wasm::Literal::~Literal(&local_168);
    break;
  case 0x19:
  case 0x1a:
  case 0x1d:
  case 0x1e:
    ::wasm::Literal::Literal(&local_2e8,(Literal *)local_90);
    truncSFloat(&local_2d0,this,(Unary *)curr_00,&local_2e8);
    Flow::Flow(__return_storage_ptr__,&local_2d0);
    ::wasm::Literal::~Literal(&local_2d0);
    ::wasm::Literal::~Literal(&local_2e8);
    break;
  case 0x1b:
  case 0x1c:
  case 0x1f:
  case 0x20:
    ::wasm::Literal::Literal(&local_318,(Literal *)local_90);
    truncUFloat(&local_300,this,(Unary *)curr_00,&local_318);
    Flow::Flow(__return_storage_ptr__,&local_300);
    ::wasm::Literal::~Literal(&local_300);
    ::wasm::Literal::~Literal(&local_318);
    break;
  case 0x21:
    ::wasm::Literal::castToI32();
    Flow::Flow(__return_storage_ptr__,&local_390);
    ::wasm::Literal::~Literal(&local_390);
    break;
  case 0x22:
    ::wasm::Literal::castToI64();
    Flow::Flow(__return_storage_ptr__,&local_3c0);
    ::wasm::Literal::~Literal(&local_3c0);
    break;
  case 0x23:
  case 0x27:
    ::wasm::Literal::convertSIToF32();
    Flow::Flow(__return_storage_ptr__,&local_1b0);
    ::wasm::Literal::~Literal(&local_1b0);
    break;
  case 0x24:
  case 0x28:
    ::wasm::Literal::convertSIToF64();
    Flow::Flow(__return_storage_ptr__,&local_1c8);
    ::wasm::Literal::~Literal(&local_1c8);
    break;
  case 0x25:
  case 0x29:
    ::wasm::Literal::convertUIToF32();
    Flow::Flow(__return_storage_ptr__,&local_180);
    ::wasm::Literal::~Literal(&local_180);
    break;
  case 0x26:
  case 0x2a:
    ::wasm::Literal::convertUIToF64();
    Flow::Flow(__return_storage_ptr__,&local_198);
    ::wasm::Literal::~Literal(&local_198);
    break;
  case 0x2b:
    ::wasm::Literal::extendToF64();
    Flow::Flow(__return_storage_ptr__,&local_3a8);
    ::wasm::Literal::~Literal(&local_3a8);
    break;
  case 0x2c:
    ::wasm::Literal::demote();
    Flow::Flow(__return_storage_ptr__,&local_3d8);
    ::wasm::Literal::~Literal(&local_3d8);
    break;
  case 0x2d:
    ::wasm::Literal::castToF32();
    Flow::Flow(__return_storage_ptr__,&local_108);
    ::wasm::Literal::~Literal(&local_108);
    break;
  case 0x2e:
    ::wasm::Literal::castToF64();
    Flow::Flow(__return_storage_ptr__,&local_120);
    ::wasm::Literal::~Literal(&local_120);
    break;
  case 0x2f:
  case 0x31:
    ::wasm::Literal::extendS8();
    Flow::Flow(__return_storage_ptr__,&local_1e0);
    ::wasm::Literal::~Literal(&local_1e0);
    break;
  case 0x30:
  case 0x32:
    ::wasm::Literal::extendS16();
    Flow::Flow(__return_storage_ptr__,&local_1f8);
    ::wasm::Literal::~Literal(&local_1f8);
    break;
  case 0x33:
    ::wasm::Literal::extendS32();
    Flow::Flow(__return_storage_ptr__,&local_210);
    ::wasm::Literal::~Literal(&local_210);
    break;
  case 0x34:
  case 0x36:
    ::wasm::Literal::truncSatToSI32();
    Flow::Flow(__return_storage_ptr__,&local_330);
    ::wasm::Literal::~Literal(&local_330);
    break;
  case 0x35:
  case 0x37:
    ::wasm::Literal::truncSatToUI32();
    Flow::Flow(__return_storage_ptr__,&local_360);
    ::wasm::Literal::~Literal(&local_360);
    break;
  case 0x38:
  case 0x3a:
    ::wasm::Literal::truncSatToSI64();
    Flow::Flow(__return_storage_ptr__,&local_348);
    ::wasm::Literal::~Literal(&local_348);
    break;
  case 0x39:
  case 0x3b:
    ::wasm::Literal::truncSatToUI64();
    Flow::Flow(__return_storage_ptr__,&local_378);
    ::wasm::Literal::~Literal(&local_378);
    break;
  case 0x3c:
    ::wasm::Literal::splatI8x16();
    Flow::Flow(__return_storage_ptr__,&local_3f0);
    ::wasm::Literal::~Literal(&local_3f0);
    break;
  case 0x3d:
    ::wasm::Literal::splatI16x8();
    Flow::Flow(__return_storage_ptr__,&local_408);
    ::wasm::Literal::~Literal(&local_408);
    break;
  case 0x3e:
    ::wasm::Literal::splatI32x4();
    Flow::Flow(__return_storage_ptr__,&local_420);
    ::wasm::Literal::~Literal(&local_420);
    break;
  case 0x3f:
    ::wasm::Literal::splatI64x2();
    Flow::Flow(__return_storage_ptr__,&local_438);
    ::wasm::Literal::~Literal(&local_438);
    break;
  case 0x40:
    ::wasm::Literal::splatF32x4();
    Flow::Flow(__return_storage_ptr__,&local_468);
    ::wasm::Literal::~Literal(&local_468);
    break;
  case 0x41:
    ::wasm::Literal::splatF64x2();
    Flow::Flow(__return_storage_ptr__,&local_480);
    ::wasm::Literal::~Literal(&local_480);
    break;
  case 0x42:
    ::wasm::Literal::notV128();
    Flow::Flow(__return_storage_ptr__,&local_498);
    ::wasm::Literal::~Literal(&local_498);
    break;
  case 0x43:
    ::wasm::Literal::anyTrueV128();
    Flow::Flow(__return_storage_ptr__,&local_4b0);
    ::wasm::Literal::~Literal(&local_4b0);
    break;
  case 0x44:
    ::wasm::Literal::absI8x16();
    Flow::Flow(__return_storage_ptr__,&local_4c8);
    ::wasm::Literal::~Literal(&local_4c8);
    break;
  case 0x45:
    ::wasm::Literal::negI8x16();
    Flow::Flow(__return_storage_ptr__,&local_4e0);
    ::wasm::Literal::~Literal(&local_4e0);
    break;
  case 0x46:
    ::wasm::Literal::allTrueI8x16();
    Flow::Flow(__return_storage_ptr__,&local_4f8);
    ::wasm::Literal::~Literal(&local_4f8);
    break;
  case 0x47:
    ::wasm::Literal::bitmaskI8x16();
    Flow::Flow(__return_storage_ptr__,&local_510);
    ::wasm::Literal::~Literal(&local_510);
    break;
  case 0x48:
    ::wasm::Literal::popcntI8x16();
    Flow::Flow(__return_storage_ptr__,&local_528);
    ::wasm::Literal::~Literal(&local_528);
    break;
  case 0x49:
    ::wasm::Literal::absI16x8();
    Flow::Flow(__return_storage_ptr__,&local_540);
    ::wasm::Literal::~Literal(&local_540);
    break;
  case 0x4a:
    ::wasm::Literal::negI16x8();
    Flow::Flow(__return_storage_ptr__,&local_558);
    ::wasm::Literal::~Literal(&local_558);
    break;
  case 0x4b:
    ::wasm::Literal::allTrueI16x8();
    Flow::Flow(__return_storage_ptr__,&local_570);
    ::wasm::Literal::~Literal(&local_570);
    break;
  case 0x4c:
    ::wasm::Literal::bitmaskI16x8();
    Flow::Flow(__return_storage_ptr__,&local_588);
    ::wasm::Literal::~Literal(&local_588);
    break;
  case 0x4d:
    ::wasm::Literal::absI32x4();
    Flow::Flow(__return_storage_ptr__,&local_5a0);
    ::wasm::Literal::~Literal(&local_5a0);
    break;
  case 0x4e:
    ::wasm::Literal::negI32x4();
    Flow::Flow(__return_storage_ptr__,&local_5b8);
    ::wasm::Literal::~Literal(&local_5b8);
    break;
  case 0x4f:
    ::wasm::Literal::allTrueI32x4();
    Flow::Flow(__return_storage_ptr__,&local_5d0);
    ::wasm::Literal::~Literal(&local_5d0);
    break;
  case 0x50:
    ::wasm::Literal::bitmaskI32x4();
    Flow::Flow(__return_storage_ptr__,&local_5e8);
    ::wasm::Literal::~Literal(&local_5e8);
    break;
  case 0x51:
    ::wasm::Literal::absI64x2();
    Flow::Flow(__return_storage_ptr__,&local_600);
    ::wasm::Literal::~Literal(&local_600);
    break;
  case 0x52:
    ::wasm::Literal::negI64x2();
    Flow::Flow(__return_storage_ptr__,&local_618);
    ::wasm::Literal::~Literal(&local_618);
    break;
  case 0x53:
    ::wasm::Literal::allTrueI64x2();
    Flow::Flow(__return_storage_ptr__,&local_630);
    ::wasm::Literal::~Literal(&local_630);
    break;
  case 0x54:
    ::wasm::Literal::bitmaskI64x2();
    Flow::Flow(__return_storage_ptr__,&local_648);
    ::wasm::Literal::~Literal(&local_648);
    break;
  case 0x55:
    ::wasm::Literal::absF16x8();
    Flow::Flow(__return_storage_ptr__,&local_660);
    ::wasm::Literal::~Literal(&local_660);
    break;
  case 0x56:
    ::wasm::Literal::negF16x8();
    Flow::Flow(__return_storage_ptr__,&local_678);
    ::wasm::Literal::~Literal(&local_678);
    break;
  case 0x57:
    ::wasm::Literal::sqrtF16x8();
    Flow::Flow(__return_storage_ptr__,&local_690);
    ::wasm::Literal::~Literal(&local_690);
    break;
  case 0x58:
    ::wasm::Literal::ceilF16x8();
    Flow::Flow(__return_storage_ptr__,&local_6a8);
    ::wasm::Literal::~Literal(&local_6a8);
    break;
  case 0x59:
    ::wasm::Literal::floorF16x8();
    Flow::Flow(__return_storage_ptr__,&local_6c0);
    ::wasm::Literal::~Literal(&local_6c0);
    break;
  case 0x5a:
    ::wasm::Literal::truncF16x8();
    Flow::Flow(__return_storage_ptr__,&local_6d8);
    ::wasm::Literal::~Literal(&local_6d8);
    break;
  case 0x5b:
    ::wasm::Literal::nearestF16x8();
    Flow::Flow(__return_storage_ptr__,&local_6f0);
    ::wasm::Literal::~Literal(&local_6f0);
    break;
  case 0x5c:
    ::wasm::Literal::absF32x4();
    Flow::Flow(__return_storage_ptr__,&local_708);
    ::wasm::Literal::~Literal(&local_708);
    break;
  case 0x5d:
    ::wasm::Literal::negF32x4();
    Flow::Flow(__return_storage_ptr__,&local_720);
    ::wasm::Literal::~Literal(&local_720);
    break;
  case 0x5e:
    ::wasm::Literal::sqrtF32x4();
    Flow::Flow(__return_storage_ptr__,&local_738);
    ::wasm::Literal::~Literal(&local_738);
    break;
  case 0x5f:
    ::wasm::Literal::ceilF32x4();
    Flow::Flow(__return_storage_ptr__,&local_750);
    ::wasm::Literal::~Literal(&local_750);
    break;
  case 0x60:
    ::wasm::Literal::floorF32x4();
    Flow::Flow(__return_storage_ptr__,&local_768);
    ::wasm::Literal::~Literal(&local_768);
    break;
  case 0x61:
    ::wasm::Literal::truncF32x4();
    Flow::Flow(__return_storage_ptr__,&local_780);
    ::wasm::Literal::~Literal(&local_780);
    break;
  case 0x62:
    ::wasm::Literal::nearestF32x4();
    Flow::Flow(__return_storage_ptr__,&local_798);
    ::wasm::Literal::~Literal(&local_798);
    break;
  case 99:
    ::wasm::Literal::absF64x2();
    Flow::Flow(__return_storage_ptr__,&local_7b0);
    ::wasm::Literal::~Literal(&local_7b0);
    break;
  case 100:
    ::wasm::Literal::negF64x2();
    Flow::Flow(__return_storage_ptr__,&local_7c8);
    ::wasm::Literal::~Literal(&local_7c8);
    break;
  case 0x65:
    ::wasm::Literal::sqrtF64x2();
    Flow::Flow(__return_storage_ptr__,&local_7e0);
    ::wasm::Literal::~Literal(&local_7e0);
    break;
  case 0x66:
    ::wasm::Literal::ceilF64x2();
    Flow::Flow(__return_storage_ptr__,&local_7f8);
    ::wasm::Literal::~Literal(&local_7f8);
    break;
  case 0x67:
    ::wasm::Literal::floorF64x2();
    Flow::Flow(__return_storage_ptr__,&local_810);
    ::wasm::Literal::~Literal(&local_810);
    break;
  case 0x68:
    ::wasm::Literal::truncF64x2();
    Flow::Flow(__return_storage_ptr__,&local_828);
    ::wasm::Literal::~Literal(&local_828);
    break;
  case 0x69:
    ::wasm::Literal::nearestF64x2();
    Flow::Flow(__return_storage_ptr__,&local_840);
    ::wasm::Literal::~Literal(&local_840);
    break;
  case 0x6a:
    ::wasm::Literal::extAddPairwiseToSI16x8();
    Flow::Flow(__return_storage_ptr__,&local_858);
    ::wasm::Literal::~Literal(&local_858);
    break;
  case 0x6b:
    ::wasm::Literal::extAddPairwiseToUI16x8();
    Flow::Flow(__return_storage_ptr__,&local_870);
    ::wasm::Literal::~Literal(&local_870);
    break;
  case 0x6c:
    ::wasm::Literal::extAddPairwiseToSI32x4();
    Flow::Flow(__return_storage_ptr__,&local_888);
    ::wasm::Literal::~Literal(&local_888);
    break;
  case 0x6d:
    ::wasm::Literal::extAddPairwiseToUI32x4();
    Flow::Flow(__return_storage_ptr__,&local_8a0);
    ::wasm::Literal::~Literal(&local_8a0);
    break;
  case 0x6e:
switchD_001a6063_caseD_6e:
    ::wasm::Literal::truncSatToSI32x4();
    Flow::Flow(__return_storage_ptr__,&local_8d0);
    ::wasm::Literal::~Literal(&local_8d0);
    break;
  case 0x6f:
switchD_001a6063_caseD_6f:
    ::wasm::Literal::truncSatToUI32x4();
    Flow::Flow(__return_storage_ptr__,&local_900);
    ::wasm::Literal::~Literal(&local_900);
    break;
  case 0x70:
    ::wasm::Literal::convertSToF32x4();
    Flow::Flow(__return_storage_ptr__,&local_918);
    ::wasm::Literal::~Literal(&local_918);
    break;
  case 0x71:
    ::wasm::Literal::convertUToF32x4();
    Flow::Flow(__return_storage_ptr__,&local_930);
    ::wasm::Literal::~Literal(&local_930);
    break;
  case 0x72:
    ::wasm::Literal::extendLowSToI16x8();
    Flow::Flow(__return_storage_ptr__,&local_948);
    ::wasm::Literal::~Literal(&local_948);
    break;
  case 0x73:
    ::wasm::Literal::extendHighSToI16x8();
    Flow::Flow(__return_storage_ptr__,&local_960);
    ::wasm::Literal::~Literal(&local_960);
    break;
  case 0x74:
    ::wasm::Literal::extendLowUToI16x8();
    Flow::Flow(__return_storage_ptr__,&local_978);
    ::wasm::Literal::~Literal(&local_978);
    break;
  case 0x75:
    ::wasm::Literal::extendHighUToI16x8();
    Flow::Flow(__return_storage_ptr__,&local_990);
    ::wasm::Literal::~Literal(&local_990);
    break;
  case 0x76:
    ::wasm::Literal::extendLowSToI32x4();
    Flow::Flow(__return_storage_ptr__,&local_9a8);
    ::wasm::Literal::~Literal(&local_9a8);
    break;
  case 0x77:
    ::wasm::Literal::extendHighSToI32x4();
    Flow::Flow(__return_storage_ptr__,&local_9c0);
    ::wasm::Literal::~Literal(&local_9c0);
    break;
  case 0x78:
    ::wasm::Literal::extendLowUToI32x4();
    Flow::Flow(__return_storage_ptr__,&local_9d8);
    ::wasm::Literal::~Literal(&local_9d8);
    break;
  case 0x79:
    ::wasm::Literal::extendHighUToI32x4();
    Flow::Flow(__return_storage_ptr__,&local_9f0);
    ::wasm::Literal::~Literal(&local_9f0);
    break;
  case 0x7a:
    ::wasm::Literal::extendLowSToI64x2();
    Flow::Flow(__return_storage_ptr__,&local_a08);
    ::wasm::Literal::~Literal(&local_a08);
    break;
  case 0x7b:
    ::wasm::Literal::extendHighSToI64x2();
    Flow::Flow(__return_storage_ptr__,&local_a20);
    ::wasm::Literal::~Literal(&local_a20);
    break;
  case 0x7c:
    ::wasm::Literal::extendLowUToI64x2();
    Flow::Flow(__return_storage_ptr__,&local_a38);
    ::wasm::Literal::~Literal(&local_a38);
    break;
  case 0x7d:
    ::wasm::Literal::extendHighUToI64x2();
    Flow::Flow(__return_storage_ptr__,&local_a50);
    ::wasm::Literal::~Literal(&local_a50);
    break;
  case 0x7e:
    ::wasm::Literal::convertLowSToF64x2();
    Flow::Flow(__return_storage_ptr__,&local_a68);
    ::wasm::Literal::~Literal(&local_a68);
    break;
  case 0x7f:
    ::wasm::Literal::convertLowUToF64x2();
    Flow::Flow(__return_storage_ptr__,&local_a80);
    ::wasm::Literal::~Literal(&local_a80);
    break;
  case 0x80:
switchD_001a6063_caseD_80:
    ::wasm::Literal::truncSatZeroSToI32x4();
    Flow::Flow(__return_storage_ptr__,&local_ab0);
    ::wasm::Literal::~Literal(&local_ab0);
    break;
  case 0x81:
switchD_001a6063_caseD_81:
    ::wasm::Literal::truncSatZeroUToI32x4();
    Flow::Flow(__return_storage_ptr__,&local_ae0);
    ::wasm::Literal::~Literal(&local_ae0);
    break;
  case 0x82:
    ::wasm::Literal::demoteZeroToF32x4();
    Flow::Flow(__return_storage_ptr__,&local_af8);
    ::wasm::Literal::~Literal(&local_af8);
    break;
  case 0x83:
    ::wasm::Literal::promoteLowToF64x2();
    Flow::Flow(__return_storage_ptr__,&local_b10);
    ::wasm::Literal::~Literal(&local_b10);
    break;
  case 0x84:
    if (this->relaxedBehavior != NonConstant) goto switchD_001a6063_caseD_6e;
    local_8b8 = NONCONSTANT_FLOW;
    pcStack_8b0 = _operator__;
    breakTo_02.super_IString.str._M_str = _operator__;
    breakTo_02.super_IString.str._M_len = NONCONSTANT_FLOW;
    Flow::Flow(__return_storage_ptr__,breakTo_02);
    break;
  case 0x85:
    if (this->relaxedBehavior != NonConstant) goto switchD_001a6063_caseD_6f;
    local_8e8 = NONCONSTANT_FLOW;
    pcStack_8e0 = _operator__;
    breakTo_01.super_IString.str._M_str = _operator__;
    breakTo_01.super_IString.str._M_len = NONCONSTANT_FLOW;
    Flow::Flow(__return_storage_ptr__,breakTo_01);
    break;
  case 0x86:
    if (this->relaxedBehavior != NonConstant) goto switchD_001a6063_caseD_80;
    local_a98 = NONCONSTANT_FLOW;
    pcStack_a90 = _operator__;
    breakTo_00.super_IString.str._M_str = _operator__;
    breakTo_00.super_IString.str._M_len = NONCONSTANT_FLOW;
    Flow::Flow(__return_storage_ptr__,breakTo_00);
    break;
  case 0x87:
    if (this->relaxedBehavior != NonConstant) goto switchD_001a6063_caseD_81;
    local_ac8 = NONCONSTANT_FLOW;
    pcStack_ac0 = _operator__;
    breakTo.super_IString.str._M_str = _operator__;
    breakTo.super_IString.str._M_len = NONCONSTANT_FLOW;
    Flow::Flow(__return_storage_ptr__,breakTo);
    break;
  case 0x88:
    ::wasm::Literal::splatF16x8();
    Flow::Flow(__return_storage_ptr__,&local_450);
    ::wasm::Literal::~Literal(&local_450);
    break;
  case 0x89:
    ::wasm::Literal::truncSatToSI16x8();
    Flow::Flow(__return_storage_ptr__,&local_b28);
    ::wasm::Literal::~Literal(&local_b28);
    break;
  case 0x8a:
    ::wasm::Literal::truncSatToUI16x8();
    Flow::Flow(__return_storage_ptr__,&local_b40);
    ::wasm::Literal::~Literal(&local_b40);
    break;
  case 0x8b:
    ::wasm::Literal::convertSToF16x8();
    Flow::Flow(__return_storage_ptr__,&local_b58);
    ::wasm::Literal::~Literal(&local_b58);
    break;
  case 0x8c:
    ::wasm::Literal::convertUToF16x8();
    Flow::Flow(__return_storage_ptr__,&local_b70);
    ::wasm::Literal::~Literal(&local_b70);
    break;
  case 0x8d:
    ::wasm::handle_unreachable
              ("invalid unary op",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
               ,0x2ac);
  default:
    ::wasm::handle_unreachable
              ("invalid op",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
               ,0x2ae);
  }
  value.type.id._0_4_ = 1;
  ::wasm::Literal::~Literal((Literal *)local_90);
LAB_001a8b5a:
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitUnary(Unary* curr) {
    NOTE_ENTER("Unary");
    Flow flow = visit(curr->value);
    if (flow.breaking()) {
      return flow;
    }
    Literal value = flow.getSingleValue();
    NOTE_EVAL1(value);
    switch (curr->op) {
      case ClzInt32:
      case ClzInt64:
        return value.countLeadingZeroes();
      case CtzInt32:
      case CtzInt64:
        return value.countTrailingZeroes();
      case PopcntInt32:
      case PopcntInt64:
        return value.popCount();
      case EqZInt32:
      case EqZInt64:
        return value.eqz();
      case ReinterpretInt32:
        return value.castToF32();
      case ReinterpretInt64:
        return value.castToF64();
      case ExtendSInt32:
        return value.extendToSI64();
      case ExtendUInt32:
        return value.extendToUI64();
      case WrapInt64:
        return value.wrapToI32();
      case ConvertUInt32ToFloat32:
      case ConvertUInt64ToFloat32:
        return value.convertUIToF32();
      case ConvertUInt32ToFloat64:
      case ConvertUInt64ToFloat64:
        return value.convertUIToF64();
      case ConvertSInt32ToFloat32:
      case ConvertSInt64ToFloat32:
        return value.convertSIToF32();
      case ConvertSInt32ToFloat64:
      case ConvertSInt64ToFloat64:
        return value.convertSIToF64();
      case ExtendS8Int32:
      case ExtendS8Int64:
        return value.extendS8();
      case ExtendS16Int32:
      case ExtendS16Int64:
        return value.extendS16();
      case ExtendS32Int64:
        return value.extendS32();
      case NegFloat32:
      case NegFloat64:
        return value.neg();
      case AbsFloat32:
      case AbsFloat64:
        return value.abs();
      case CeilFloat32:
      case CeilFloat64:
        return value.ceil();
      case FloorFloat32:
      case FloorFloat64:
        return value.floor();
      case TruncFloat32:
      case TruncFloat64:
        return value.trunc();
      case NearestFloat32:
      case NearestFloat64:
        return value.nearbyint();
      case SqrtFloat32:
      case SqrtFloat64:
        return value.sqrt();
      case TruncSFloat32ToInt32:
      case TruncSFloat64ToInt32:
      case TruncSFloat32ToInt64:
      case TruncSFloat64ToInt64:
        return truncSFloat(curr, value);
      case TruncUFloat32ToInt32:
      case TruncUFloat64ToInt32:
      case TruncUFloat32ToInt64:
      case TruncUFloat64ToInt64:
        return truncUFloat(curr, value);
      case TruncSatSFloat32ToInt32:
      case TruncSatSFloat64ToInt32:
        return value.truncSatToSI32();
      case TruncSatSFloat32ToInt64:
      case TruncSatSFloat64ToInt64:
        return value.truncSatToSI64();
      case TruncSatUFloat32ToInt32:
      case TruncSatUFloat64ToInt32:
        return value.truncSatToUI32();
      case TruncSatUFloat32ToInt64:
      case TruncSatUFloat64ToInt64:
        return value.truncSatToUI64();
      case ReinterpretFloat32:
        return value.castToI32();
      case PromoteFloat32:
        return value.extendToF64();
      case ReinterpretFloat64:
        return value.castToI64();
      case DemoteFloat64:
        return value.demote();
      case SplatVecI8x16:
        return value.splatI8x16();
      case SplatVecI16x8:
        return value.splatI16x8();
      case SplatVecI32x4:
        return value.splatI32x4();
      case SplatVecI64x2:
        return value.splatI64x2();
      case SplatVecF16x8:
        return value.splatF16x8();
      case SplatVecF32x4:
        return value.splatF32x4();
      case SplatVecF64x2:
        return value.splatF64x2();
      case NotVec128:
        return value.notV128();
      case AnyTrueVec128:
        return value.anyTrueV128();
      case AbsVecI8x16:
        return value.absI8x16();
      case NegVecI8x16:
        return value.negI8x16();
      case AllTrueVecI8x16:
        return value.allTrueI8x16();
      case BitmaskVecI8x16:
        return value.bitmaskI8x16();
      case PopcntVecI8x16:
        return value.popcntI8x16();
      case AbsVecI16x8:
        return value.absI16x8();
      case NegVecI16x8:
        return value.negI16x8();
      case AllTrueVecI16x8:
        return value.allTrueI16x8();
      case BitmaskVecI16x8:
        return value.bitmaskI16x8();
      case AbsVecI32x4:
        return value.absI32x4();
      case NegVecI32x4:
        return value.negI32x4();
      case AllTrueVecI32x4:
        return value.allTrueI32x4();
      case BitmaskVecI32x4:
        return value.bitmaskI32x4();
      case AbsVecI64x2:
        return value.absI64x2();
      case NegVecI64x2:
        return value.negI64x2();
      case AllTrueVecI64x2:
        return value.allTrueI64x2();
      case BitmaskVecI64x2:
        return value.bitmaskI64x2();
      case AbsVecF16x8:
        return value.absF16x8();
      case NegVecF16x8:
        return value.negF16x8();
      case SqrtVecF16x8:
        return value.sqrtF16x8();
      case CeilVecF16x8:
        return value.ceilF16x8();
      case FloorVecF16x8:
        return value.floorF16x8();
      case TruncVecF16x8:
        return value.truncF16x8();
      case NearestVecF16x8:
        return value.nearestF16x8();
      case AbsVecF32x4:
        return value.absF32x4();
      case NegVecF32x4:
        return value.negF32x4();
      case SqrtVecF32x4:
        return value.sqrtF32x4();
      case CeilVecF32x4:
        return value.ceilF32x4();
      case FloorVecF32x4:
        return value.floorF32x4();
      case TruncVecF32x4:
        return value.truncF32x4();
      case NearestVecF32x4:
        return value.nearestF32x4();
      case AbsVecF64x2:
        return value.absF64x2();
      case NegVecF64x2:
        return value.negF64x2();
      case SqrtVecF64x2:
        return value.sqrtF64x2();
      case CeilVecF64x2:
        return value.ceilF64x2();
      case FloorVecF64x2:
        return value.floorF64x2();
      case TruncVecF64x2:
        return value.truncF64x2();
      case NearestVecF64x2:
        return value.nearestF64x2();
      case ExtAddPairwiseSVecI8x16ToI16x8:
        return value.extAddPairwiseToSI16x8();
      case ExtAddPairwiseUVecI8x16ToI16x8:
        return value.extAddPairwiseToUI16x8();
      case ExtAddPairwiseSVecI16x8ToI32x4:
        return value.extAddPairwiseToSI32x4();
      case ExtAddPairwiseUVecI16x8ToI32x4:
        return value.extAddPairwiseToUI32x4();
      case RelaxedTruncSVecF32x4ToVecI32x4:
        // TODO: We could do this only if the actual values are in the relaxed
        //       range.
        if (relaxedBehavior == RelaxedBehavior::NonConstant) {
          return NONCONSTANT_FLOW;
        }
        [[fallthrough]];
      case TruncSatSVecF32x4ToVecI32x4:
        return value.truncSatToSI32x4();
      case RelaxedTruncUVecF32x4ToVecI32x4:
        if (relaxedBehavior == RelaxedBehavior::NonConstant) {
          return NONCONSTANT_FLOW;
        }
        [[fallthrough]];
      case TruncSatUVecF32x4ToVecI32x4:
        return value.truncSatToUI32x4();
      case ConvertSVecI32x4ToVecF32x4:
        return value.convertSToF32x4();
      case ConvertUVecI32x4ToVecF32x4:
        return value.convertUToF32x4();
      case ExtendLowSVecI8x16ToVecI16x8:
        return value.extendLowSToI16x8();
      case ExtendHighSVecI8x16ToVecI16x8:
        return value.extendHighSToI16x8();
      case ExtendLowUVecI8x16ToVecI16x8:
        return value.extendLowUToI16x8();
      case ExtendHighUVecI8x16ToVecI16x8:
        return value.extendHighUToI16x8();
      case ExtendLowSVecI16x8ToVecI32x4:
        return value.extendLowSToI32x4();
      case ExtendHighSVecI16x8ToVecI32x4:
        return value.extendHighSToI32x4();
      case ExtendLowUVecI16x8ToVecI32x4:
        return value.extendLowUToI32x4();
      case ExtendHighUVecI16x8ToVecI32x4:
        return value.extendHighUToI32x4();
      case ExtendLowSVecI32x4ToVecI64x2:
        return value.extendLowSToI64x2();
      case ExtendHighSVecI32x4ToVecI64x2:
        return value.extendHighSToI64x2();
      case ExtendLowUVecI32x4ToVecI64x2:
        return value.extendLowUToI64x2();
      case ExtendHighUVecI32x4ToVecI64x2:
        return value.extendHighUToI64x2();
      case ConvertLowSVecI32x4ToVecF64x2:
        return value.convertLowSToF64x2();
      case ConvertLowUVecI32x4ToVecF64x2:
        return value.convertLowUToF64x2();
      case RelaxedTruncZeroSVecF64x2ToVecI32x4:
        if (relaxedBehavior == RelaxedBehavior::NonConstant) {
          return NONCONSTANT_FLOW;
        }
        [[fallthrough]];
      case TruncSatZeroSVecF64x2ToVecI32x4:
        return value.truncSatZeroSToI32x4();
      case RelaxedTruncZeroUVecF64x2ToVecI32x4:
        if (relaxedBehavior == RelaxedBehavior::NonConstant) {
          return NONCONSTANT_FLOW;
        }
        [[fallthrough]];
      case TruncSatZeroUVecF64x2ToVecI32x4:
        return value.truncSatZeroUToI32x4();
      case DemoteZeroVecF64x2ToVecF32x4:
        return value.demoteZeroToF32x4();
      case PromoteLowVecF32x4ToVecF64x2:
        return value.promoteLowToF64x2();
      case TruncSatSVecF16x8ToVecI16x8:
        return value.truncSatToSI16x8();
      case TruncSatUVecF16x8ToVecI16x8:
        return value.truncSatToUI16x8();
      case ConvertSVecI16x8ToVecF16x8:
        return value.convertSToF16x8();
      case ConvertUVecI16x8ToVecF16x8:
        return value.convertUToF16x8();
      case InvalidUnary:
        WASM_UNREACHABLE("invalid unary op");
    }
    WASM_UNREACHABLE("invalid op");
  }